

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::DeepScanLineOutputFile::initialize(DeepScanLineOutputFile *this,Header *header)

{
  int iVar1;
  uint *puVar2;
  Array<char> *pAVar3;
  char *pcVar4;
  void *pvVar5;
  pointer ppLVar6;
  Format FVar7;
  int iVar8;
  Box2i *pBVar9;
  LineOrder *pLVar10;
  uint *puVar11;
  Compression *pCVar12;
  Compressor *pCVar13;
  LineBuffer *pLVar14;
  long *plVar15;
  char *pcVar16;
  Data *pDVar17;
  long lVar18;
  Data *this_00;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  
  Header::operator=(&this->_data->header,header);
  Header::setType(&this->_data->header,(string *)&DEEPSCANLINE_abi_cxx11_);
  pBVar9 = Header::dataWindow(header);
  pLVar10 = Header::lineOrder(header);
  iVar8 = (pBVar9->min).y;
  iVar1 = (pBVar9->max).y;
  iVar22 = iVar1;
  if (*pLVar10 == INCREASING_Y) {
    iVar22 = iVar8;
  }
  pDVar17 = this->_data;
  pDVar17->currentScanLine = iVar22;
  pDVar17->missingScanLines = (iVar1 - iVar8) + 1;
  pLVar10 = Header::lineOrder(header);
  pDVar17 = this->_data;
  pDVar17->lineOrder = *pLVar10;
  iVar8 = (pBVar9->min).y;
  iVar1 = (pBVar9->max).x;
  iVar22 = (pBVar9->max).y;
  pDVar17->minX = (pBVar9->min).x;
  pDVar17->maxX = iVar1;
  pDVar17->minY = iVar8;
  pDVar17->maxY = iVar22;
  iVar22 = iVar22 - iVar8;
  uVar21 = 0xffffffffffffffff;
  if (-2 < iVar22) {
    uVar21 = (long)iVar22 * 4 + 4;
  }
  puVar11 = (uint *)operator_new__(uVar21);
  puVar2 = (pDVar17->lineSampleCount)._data;
  this_00 = pDVar17;
  if (puVar2 != (uint *)0x0) {
    operator_delete__(puVar2);
    this_00 = this->_data;
  }
  (pDVar17->lineSampleCount)._size = (long)iVar22 + 1;
  (pDVar17->lineSampleCount)._data = puVar11;
  pCVar12 = Header::compression(&this_00->header);
  pCVar13 = newCompressor(*pCVar12,0,&this->_data->header);
  FVar7 = defaultFormat(pCVar13);
  this->_data->format = FVar7;
  iVar8 = numLinesInBuffer(pCVar13);
  pDVar17 = this->_data;
  pDVar17->linesInBuffer = iVar8;
  if (pCVar13 != (Compressor *)0x0) {
    (*pCVar13->_vptr_Compressor[1])(pCVar13);
    pDVar17 = this->_data;
    iVar8 = pDVar17->linesInBuffer;
  }
  iVar8 = ((pDVar17->maxY - pDVar17->minY) + iVar8) / iVar8;
  Header::setChunkCount(&pDVar17->header,iVar8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->_data->lineOffsets,(long)iVar8);
  pDVar17 = this->_data;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&pDVar17->bytesPerLine,(long)((pDVar17->maxY - pDVar17->minY) + 1));
  pDVar17 = this->_data;
  iVar8 = (pDVar17->maxY - pDVar17->minY) + 1;
  if (pDVar17->linesInBuffer <= iVar8) {
    iVar8 = pDVar17->linesInBuffer;
  }
  pDVar17->maxSampleCountTableSize = (long)(((pDVar17->maxX - pDVar17->minX) + 1) * iVar8) << 2;
  if ((pDVar17->lineBuffers).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pDVar17->lineBuffers).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar21 = 0;
    do {
      pLVar14 = (LineBuffer *)operator_new(200);
      iVar8 = pDVar17->linesInBuffer;
      lVar18 = (long)iVar8;
      pLVar14->sampleCountTableCompressor = (Compressor *)0x0;
      pLVar14->compressor = (Compressor *)0x0;
      pLVar14->partiallyFull = false;
      pLVar14->hasException = false;
      (pLVar14->buffer)._size = 0;
      (pLVar14->buffer)._data = (Array<char> *)0x0;
      (pLVar14->consecutiveBuffer)._size = 0;
      (pLVar14->consecutiveBuffer)._data = (char *)0x0;
      pLVar14->dataPtr = (char *)0x0;
      pLVar14->dataSize = 0;
      (pLVar14->sampleCountTableBuffer)._size = 0;
      *(undefined1 (*) [16])&(pLVar14->sampleCountTableBuffer)._data = (undefined1  [16])0x0;
      (pLVar14->exception)._M_dataplus._M_p = (pointer)&(pLVar14->exception).field_2;
      (pLVar14->exception)._M_string_length = 0;
      (pLVar14->exception).field_2._M_local_buf[0] = '\0';
      IlmThread_3_4::Semaphore::Semaphore(&pLVar14->_sem,1);
      uVar19 = lVar18 * 0x10 + 8;
      if (iVar8 < 0) {
        uVar19 = 0xffffffffffffffff;
      }
      plVar15 = (long *)operator_new__(uVar19);
      *plVar15 = lVar18;
      if (iVar8 != 0) {
        memset((Array<char> *)(plVar15 + 1),0,lVar18 * 0x10);
      }
      pAVar3 = (pLVar14->buffer)._data;
      if (pAVar3 != (Array<char> *)0x0) {
        pcVar4 = pAVar3[-1]._data;
        if (pcVar4 != (char *)0x0) {
          lVar20 = (long)pcVar4 << 4;
          do {
            pvVar5 = *(void **)((long)&pAVar3[-1]._data + lVar20);
            if (pvVar5 != (void *)0x0) {
              operator_delete__(pvVar5);
            }
            lVar20 = lVar20 + -0x10;
          } while (lVar20 != 0);
        }
        operator_delete__(&pAVar3[-1]._data,(long)pcVar4 << 4 | 8);
      }
      (pLVar14->buffer)._size = lVar18;
      (pLVar14->buffer)._data = (Array<char> *)(plVar15 + 1);
      (this->_data->lineBuffers).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar21] = pLVar14;
      pDVar17 = this->_data;
      uVar19 = pDVar17->maxSampleCountTableSize;
      pLVar14 = (pDVar17->lineBuffers).
                super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar21];
      pcVar16 = (char *)operator_new__(uVar19);
      pcVar4 = (pLVar14->sampleCountTableBuffer)._data;
      if (pcVar4 != (char *)0x0) {
        operator_delete__(pcVar4);
        pDVar17 = this->_data;
      }
      (pLVar14->sampleCountTableBuffer)._size = uVar19;
      (pLVar14->sampleCountTableBuffer)._data = pcVar16;
      pCVar12 = Header::compression(&pDVar17->header);
      pCVar13 = newCompressor(*pCVar12,this->_data->maxSampleCountTableSize,&this->_data->header);
      pDVar17 = this->_data;
      ppLVar6 = (pDVar17->lineBuffers).
                super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppLVar6[uVar21]->sampleCountTableCompressor = pCVar13;
      uVar21 = uVar21 + 1;
    } while (uVar21 < (ulong)((long)(pDVar17->lineBuffers).
                                    super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar6 >> 3)
            );
  }
  return;
}

Assistant:

void
DeepScanLineOutputFile::initialize (const Header& header)
{
    _data->header = header;

    _data->header.setType (DEEPSCANLINE);

    const Box2i& dataWindow = header.dataWindow ();

    _data->currentScanLine = (header.lineOrder () == INCREASING_Y)
                                 ? dataWindow.min.y
                                 : dataWindow.max.y;

    _data->missingScanLines = dataWindow.max.y - dataWindow.min.y + 1;
    _data->lineOrder        = header.lineOrder ();
    _data->minX             = dataWindow.min.x;
    _data->maxX             = dataWindow.max.x;
    _data->minY             = dataWindow.min.y;
    _data->maxY             = dataWindow.max.y;

    _data->lineSampleCount.resizeErase (_data->maxY - _data->minY + 1);

    Compressor* compressor =
        newCompressor (_data->header.compression (), 0, _data->header);
    _data->format        = defaultFormat (compressor);
    _data->linesInBuffer = numLinesInBuffer (compressor);
    if (compressor != 0) delete compressor;

    int lineOffsetSize = (_data->maxY - _data->minY + _data->linesInBuffer) /
                         _data->linesInBuffer;

    _data->header.setChunkCount (lineOffsetSize);

    _data->lineOffsets.resize (lineOffsetSize);

    _data->bytesPerLine.resize (_data->maxY - _data->minY + 1);

    _data->maxSampleCountTableSize =
        min (_data->linesInBuffer, _data->maxY - _data->minY + 1) *
        (_data->maxX - _data->minX + 1) * sizeof (unsigned int);

    for (size_t i = 0; i < _data->lineBuffers.size (); ++i)
    {
        _data->lineBuffers[i] = new LineBuffer (_data->linesInBuffer);
        _data->lineBuffers[i]->sampleCountTableBuffer.resizeErase (
            static_cast<long> (_data->maxSampleCountTableSize));

        _data->lineBuffers[i]->sampleCountTableCompressor = newCompressor (
            _data->header.compression (),
            _data->maxSampleCountTableSize,
            _data->header);
    }
}